

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void SobelRow_C(uint8 *src_sobelx,uint8 *src_sobely,uint8 *dst_argb,int width)

{
  ulong uVar1;
  uint8 uVar2;
  
  if (0 < width) {
    uVar1 = 0;
    do {
      uVar2 = (uint8)((uint)src_sobely[uVar1] + (uint)src_sobelx[uVar1]);
      if (0xfe < (uint)src_sobely[uVar1] + (uint)src_sobelx[uVar1]) {
        uVar2 = 0xff;
      }
      dst_argb[uVar1 * 4] = uVar2;
      dst_argb[uVar1 * 4 + 1] = uVar2;
      dst_argb[uVar1 * 4 + 2] = uVar2;
      dst_argb[uVar1 * 4 + 3] = 0xff;
      uVar1 = uVar1 + 1;
    } while ((uint)width != uVar1);
  }
  return;
}

Assistant:

void SobelRow_C(const uint8* src_sobelx,
                const uint8* src_sobely,
                uint8* dst_argb,
                int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int s = clamp255(r + b);
    dst_argb[0] = (uint8)(s);
    dst_argb[1] = (uint8)(s);
    dst_argb[2] = (uint8)(s);
    dst_argb[3] = (uint8)(255u);
    dst_argb += 4;
  }
}